

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

void __thiscall CVmObjFile::switch_read_write_mode(CVmObjFile *this,int writing)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  
  if ((writing != 0) && (lVar1 = *(long *)((this->super_CVmObject).ext_ + 0x20), lVar1 != 0)) {
    *(undefined8 *)(lVar1 + 8) = 0;
  }
  pcVar4 = (this->super_CVmObject).ext_;
  uVar5 = *(ulong *)(pcVar4 + 0x18);
  if ((uVar5 & 2) != 0) {
    if ((writing == 0) != ((uVar5 & 4) == 0)) {
      plVar2 = *(long **)(pcVar4 + 8);
      lVar3 = (**(code **)(*plVar2 + 0x38))(plVar2);
      lVar1 = *(long *)((this->super_CVmObject).ext_ + 0x20);
      if (lVar1 != 0) {
        lVar3 = lVar3 - *(long *)(lVar1 + 8);
      }
      (**(code **)(*plVar2 + 0x40))(plVar2,lVar3,0);
      pcVar4 = (this->super_CVmObject).ext_;
      uVar5 = *(ulong *)(pcVar4 + 0x18);
    }
  }
  *(ulong *)(pcVar4 + 0x18) = uVar5 | 2;
  pcVar4 = (this->super_CVmObject).ext_;
  *(ulong *)(pcVar4 + 0x18) =
       (*(ulong *)(pcVar4 + 0x18) & 0xfffffffffffffffb) + (ulong)(writing != 0) * 4;
  return;
}

Assistant:

void CVmObjFile::switch_read_write_mode(VMG_ int writing)
{
    /* if we're writing, invalidate the read buffer */
    if (writing && get_ext()->readbuf != 0)
        get_ext()->readbuf->rem = 0;

    /* 
     *   if we just performed a read or write operation, we must seek if
     *   we're performing the opposite type of operation now 
     */
    if ((get_ext()->flags & VMOBJFILE_STDIO_BUF_DIRTY) != 0)
    {
        int was_writing;

        /* check what type of operation we did last */
        was_writing = ((get_ext()->flags & VMOBJFILE_LAST_OP_WRITE) != 0);

        /* 
         *   if we're switching operations, explicitly seek to the current
         *   location to flush the stdio buffers 
         */
        if ((writing && !was_writing) || (!writing && was_writing))
            get_ext()->fp->seek(get_pos(vmg0_), OSFSK_SET);
    }

    /* 
     *   remember that this operation is stdio-buffered, so that we'll know
     *   we need to seek if we perform the opposite operation after this one 
     */
    get_ext()->flags |= VMOBJFILE_STDIO_BUF_DIRTY;

    /* remember which type of operation we're performing */
    if (writing)
        get_ext()->flags |= VMOBJFILE_LAST_OP_WRITE;
    else
        get_ext()->flags &= ~VMOBJFILE_LAST_OP_WRITE;
}